

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

void Abc_ShaManStop(Abc_ShaMan_t *p)

{
  void *__ptr;
  void *__ptr_00;
  int iVar1;
  Vec_Ptr_t *__ptr_01;
  Vec_Int_t *__ptr_02;
  long lVar2;
  long lVar3;
  
  __ptr_01 = p->vBuckets;
  if (0 < __ptr_01->nSize) {
    lVar2 = 0;
    do {
      __ptr = __ptr_01->pArray[lVar2];
      iVar1 = *(int *)((long)__ptr + 4);
      if (0 < iVar1) {
        lVar3 = 0;
        do {
          __ptr_00 = *(void **)(*(long *)((long)__ptr + 8) + lVar3 * 8);
          if (__ptr_00 != (void *)0x0) {
            if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
              free(*(void **)((long)__ptr_00 + 8));
            }
            free(__ptr_00);
            iVar1 = *(int *)((long)__ptr + 4);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar1);
      }
      if (*(void **)((long)__ptr + 8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
      }
      free(__ptr);
      lVar2 = lVar2 + 1;
      __ptr_01 = p->vBuckets;
    } while (lVar2 < __ptr_01->nSize);
  }
  if (__ptr_01->pArray == (void **)0x0) {
LAB_002c5bb4:
    free(__ptr_01);
    p->vBuckets = (Vec_Ptr_t *)0x0;
  }
  else {
    free(__ptr_01->pArray);
    p->vBuckets->pArray = (void **)0x0;
    __ptr_01 = p->vBuckets;
    if (__ptr_01 != (Vec_Ptr_t *)0x0) goto LAB_002c5bb4;
  }
  __ptr_02 = p->vObj2Lit;
  if (__ptr_02 != (Vec_Int_t *)0x0) {
    if (__ptr_02->pArray != (int *)0x0) {
      free(__ptr_02->pArray);
      p->vObj2Lit->pArray = (int *)0x0;
      __ptr_02 = p->vObj2Lit;
      if (__ptr_02 == (Vec_Int_t *)0x0) goto LAB_002c5bf5;
    }
    free(__ptr_02);
  }
LAB_002c5bf5:
  free(p);
  return;
}

Assistant:

void Abc_ShaManStop( Abc_ShaMan_t * p )
{
    Vec_Ptr_t * vBucket;
    int i;
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
        Vec_VecFree( (Vec_Vec_t *)vBucket );
    Vec_PtrFreeP( &p->vBuckets );
    Vec_IntFreeP( &p->vObj2Lit );
    ABC_FREE( p );
}